

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall asmjit::_abi_1_10::BaseBuilder::serializeTo(BaseBuilder *this,BaseEmitter *dst)

{
  BaseEmitter *pBVar1;
  bool bVar2;
  AlignMode AVar3;
  TypeId TVar4;
  InstOptions options;
  InstId IVar5;
  uint32_t uVar6;
  char *pcVar7;
  ConstPool *pCVar8;
  uint8_t *puVar9;
  size_t sVar10;
  size_t sVar11;
  SectionNode *this_00;
  Section *pSVar12;
  BaseNode *this_01;
  BaseEmitter *in_RSI;
  long in_RDI;
  Label LVar13;
  CommentNode *node_8;
  SectionNode *node_7;
  EmbedLabelDeltaNode *node_6;
  EmbedLabelNode *node_5;
  EmbedDataNode *node_4;
  AlignNode *node_3;
  LabelNode *node_2;
  ConstPoolNode *node_1;
  uint32_t i;
  uint32_t opCount;
  Operand_ *opExt;
  Operand_ *op;
  InstNode *node;
  Operand_ opArray [6];
  BaseNode *node_;
  Error err;
  BaseEmitter *in_stack_fffffffffffffe38;
  CodeHolder *in_stack_fffffffffffffe40;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  EmbedLabelDeltaNode *local_108;
  undefined1 local_100 [16];
  EmbedLabelNode *local_f0;
  EmbedDataNode *local_e8;
  AlignNode *local_e0;
  undefined1 local_d8 [16];
  LabelNode *local_c8;
  undefined1 local_c0 [16];
  ConstPoolNode *local_b0;
  uint local_a8;
  uint local_a4;
  undefined8 *local_a0;
  Operand *local_98;
  InstNode *local_90;
  Operand_ local_88 [3];
  undefined8 local_58;
  undefined8 local_50;
  BaseNode *local_20;
  Error local_14;
  BaseEmitter *local_10;
  
  local_14 = 0;
  local_20 = *(BaseNode **)(in_RDI + 0x188);
  local_10 = in_RSI;
  do {
    pBVar1 = local_10;
    pcVar7 = BaseNode::inlineComment(local_20);
    BaseEmitter::setInlineComment(pBVar1,pcVar7);
    bVar2 = BaseNode::isInst((BaseNode *)0x115ffb);
    if (bVar2) {
      local_90 = BaseNode::as<asmjit::_abi_1_10::InstNode>(local_20);
      pBVar1 = local_10;
      options = InstNode::options((InstNode *)0x116033);
      BaseEmitter::setInstOptions(pBVar1,options);
      InstNode::extraReg((InstNode *)0x116059);
      BaseEmitter::setExtraReg
                ((BaseEmitter *)in_stack_fffffffffffffe40,(RegOnly *)in_stack_fffffffffffffe38);
      local_98 = InstNode::operands(local_90);
      local_a0 = (undefined8 *)EmitterUtils::noExt;
      local_a4 = InstNode::opCount(local_90);
      if (3 < local_a4) {
        local_a8 = 4;
        local_58._0_4_ = local_98[3].super_Operand_._signature;
        local_58._4_4_ = local_98[3].super_Operand_._baseId;
        local_50 = *(undefined8 *)local_98[3].super_Operand_._data;
        for (; local_a8 < local_a4; local_a8 = local_a8 + 1) {
          Operand_::copyFrom(local_88 + local_a8,&local_98[local_a8].super_Operand_);
        }
        for (; local_a8 < 6; local_a8 = local_a8 + 1) {
          Operand_::reset((Operand_ *)in_stack_fffffffffffffe40);
        }
        local_a0 = &local_58;
      }
      pBVar1 = local_10;
      IVar5 = InstNode::id((InstNode *)0x116193);
      local_14 = (**(code **)((long)&(((BaseNode *)&pBVar1->_vptr_BaseEmitter)->field_0)._links[0]
                                     [1].field_0 + 8))
                           (pBVar1,IVar5,local_98,local_98 + 1,local_98 + 2,local_a0);
    }
    else {
      bVar2 = BaseNode::isLabel((BaseNode *)0x1161e1);
      if (bVar2) {
        bVar2 = BaseNode::isConstPool((BaseNode *)0x1161f7);
        if (bVar2) {
          local_b0 = BaseNode::as<asmjit::_abi_1_10::ConstPoolNode>(local_20);
          pBVar1 = local_10;
          LabelNode::label((LabelNode *)in_stack_fffffffffffffe38);
          pCVar8 = ConstPoolNode::constPool(local_b0);
          local_14 = (**(code **)&(((BaseNode *)&pBVar1->_vptr_BaseEmitter)->field_0)._links[0][2].
                                  field_0)(pBVar1,local_c0,pCVar8);
        }
        else {
          local_c8 = BaseNode::as<asmjit::_abi_1_10::LabelNode>(local_20);
          pBVar1 = local_10;
          LVar13 = LabelNode::label((LabelNode *)in_stack_fffffffffffffe38);
          local_14 = (**(code **)&(((BaseNode *)&pBVar1->_vptr_BaseEmitter)->field_0)._links[0][1].
                                  field_0)
                               (pBVar1,local_d8,LVar13.super_Operand.super_Operand_._data);
        }
      }
      else {
        bVar2 = BaseNode::isAlign((BaseNode *)0x1162c3);
        if (bVar2) {
          local_e0 = BaseNode::as<asmjit::_abi_1_10::AlignNode>(local_20);
          pBVar1 = local_10;
          AVar3 = AlignNode::alignMode(local_e0);
          uVar6 = AlignNode::alignment(local_e0);
          local_14 = (*(code *)(((BaseNode *)&pBVar1->_vptr_BaseEmitter)->field_0)._links[0][1].
                               field_3)(pBVar1,AVar3,uVar6,AVar3);
        }
        else {
          bVar2 = BaseNode::isEmbedData((BaseNode *)0x116336);
          if (bVar2) {
            local_e8 = BaseNode::as<asmjit::_abi_1_10::EmbedDataNode>(local_20);
            pBVar1 = local_10;
            TVar4 = EmbedDataNode::typeId(local_e8);
            puVar9 = EmbedDataNode::data((EmbedDataNode *)in_stack_fffffffffffffe40);
            sVar10 = EmbedDataNode::itemCount(local_e8);
            sVar11 = EmbedDataNode::repeatCount(local_e8);
            local_14 = (*(code *)(((BaseNode *)&pBVar1->_vptr_BaseEmitter)->field_0)._links[0][1].
                                 _inlineComment)(pBVar1,TVar4,puVar9,sVar10,sVar11);
          }
          else {
            bVar2 = BaseNode::isEmbedLabel((BaseNode *)0x1163dd);
            if (bVar2) {
              local_f0 = BaseNode::as<asmjit::_abi_1_10::EmbedLabelNode>(local_20);
              pBVar1 = local_10;
              EmbedLabelNode::label((EmbedLabelNode *)in_stack_fffffffffffffe38);
              uVar6 = EmbedLabelNode::dataSize(local_f0);
              local_14 = (**(code **)((long)&(((BaseNode *)&pBVar1->_vptr_BaseEmitter)->field_0).
                                             _links[0][2].field_0 + 8))(pBVar1,local_100,uVar6);
            }
            else {
              bVar2 = BaseNode::isEmbedLabelDelta((BaseNode *)0x116457);
              if (bVar2) {
                local_108 = BaseNode::as<asmjit::_abi_1_10::EmbedLabelDeltaNode>(local_20);
                pBVar1 = local_10;
                EmbedLabelDeltaNode::label((EmbedLabelDeltaNode *)in_stack_fffffffffffffe38);
                EmbedLabelDeltaNode::baseLabel((EmbedLabelDeltaNode *)in_stack_fffffffffffffe38);
                uVar6 = EmbedLabelDeltaNode::dataSize(local_108);
                local_14 = (**(code **)&(((BaseNode *)&pBVar1->_vptr_BaseEmitter)->field_0)._links
                                        [0][2].field_1)(pBVar1,local_118,local_128,uVar6);
              }
              else {
                bVar2 = BaseNode::isSection((BaseNode *)0x1164f1);
                if (bVar2) {
                  this_00 = BaseNode::as<asmjit::_abi_1_10::SectionNode>(local_20);
                  pBVar1 = local_10;
                  in_stack_fffffffffffffe40 = *(CodeHolder **)(in_RDI + 0x30);
                  SectionNode::id(this_00);
                  pSVar12 = CodeHolder::sectionById
                                      (in_stack_fffffffffffffe40,
                                       (uint32_t)((ulong)in_stack_fffffffffffffe38 >> 0x20));
                  local_14 = (*(code *)((((BaseNode *)&pBVar1->_vptr_BaseEmitter)->field_0).field_0.
                                       _prev)->field_3)(pBVar1,pSVar12);
                }
                else {
                  bVar2 = BaseNode::isComment((BaseNode *)0x11656a);
                  if (bVar2) {
                    this_01 = &BaseNode::as<asmjit::_abi_1_10::CommentNode>(local_20)->
                               super_BaseNode;
                    in_stack_fffffffffffffe38 = local_10;
                    pcVar7 = BaseNode::inlineComment(this_01);
                    local_14 = (*(code *)(((BaseNode *)&in_stack_fffffffffffffe38->_vptr_BaseEmitter
                                          )->field_0)._links[0][2].field_3)
                                         (in_stack_fffffffffffffe38,pcVar7,0xffffffffffffffff);
                  }
                }
              }
            }
          }
        }
      }
    }
  } while ((local_14 == 0) && (local_20 = BaseNode::next(local_20), local_20 != (BaseNode *)0x0));
  return local_14;
}

Assistant:

Error BaseBuilder::serializeTo(BaseEmitter* dst) {
  Error err = kErrorOk;
  BaseNode* node_ = _firstNode;

  Operand_ opArray[Globals::kMaxOpCount];

  do {
    dst->setInlineComment(node_->inlineComment());

    if (node_->isInst()) {
      InstNode* node = node_->as<InstNode>();

      // NOTE: Inlined to remove one additional call per instruction.
      dst->setInstOptions(node->options());
      dst->setExtraReg(node->extraReg());

      const Operand_* op = node->operands();
      const Operand_* opExt = EmitterUtils::noExt;

      uint32_t opCount = node->opCount();
      if (opCount > 3) {
        uint32_t i = 4;
        opArray[3] = op[3];

        while (i < opCount) {
          opArray[i].copyFrom(op[i]);
          i++;
        }
        while (i < Globals::kMaxOpCount) {
          opArray[i].reset();
          i++;
        }
        opExt = opArray + 3;
      }

      err = dst->_emit(node->id(), op[0], op[1], op[2], opExt);
    }
    else if (node_->isLabel()) {
      if (node_->isConstPool()) {
        ConstPoolNode* node = node_->as<ConstPoolNode>();
        err = dst->embedConstPool(node->label(), node->constPool());
      }
      else {
        LabelNode* node = node_->as<LabelNode>();
        err = dst->bind(node->label());
      }
    }
    else if (node_->isAlign()) {
      AlignNode* node = node_->as<AlignNode>();
      err = dst->align(node->alignMode(), node->alignment());
    }
    else if (node_->isEmbedData()) {
      EmbedDataNode* node = node_->as<EmbedDataNode>();
      err = dst->embedDataArray(node->typeId(), node->data(), node->itemCount(), node->repeatCount());
    }
    else if (node_->isEmbedLabel()) {
      EmbedLabelNode* node = node_->as<EmbedLabelNode>();
      err = dst->embedLabel(node->label(), node->dataSize());
    }
    else if (node_->isEmbedLabelDelta()) {
      EmbedLabelDeltaNode* node = node_->as<EmbedLabelDeltaNode>();
      err = dst->embedLabelDelta(node->label(), node->baseLabel(), node->dataSize());
    }
    else if (node_->isSection()) {
      SectionNode* node = node_->as<SectionNode>();
      err = dst->section(_code->sectionById(node->id()));
    }
    else if (node_->isComment()) {
      CommentNode* node = node_->as<CommentNode>();
      err = dst->comment(node->inlineComment());
    }

    if (err) break;
    node_ = node_->next();
  } while (node_);

  return err;
}